

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O2

string * get_std_name(string *__return_storage_ptr__,string *name,string *real_name)

{
  bool bVar1;
  allocator local_19;
  
  bVar1 = has_std_locale(name);
  if (bVar1) {
    if (real_name != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)real_name);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_std_name(std::string const &name,std::string *real_name = 0)
{
    if(has_std_locale(name)) {
        if(real_name)
            *real_name = name;
        return name;
    }

    #ifdef BOOSTER_WIN_NATIVE
    bool utf8=name.find("UTF-8")!=std::string::npos;

    if(name=="en_US.UTF-8" || name == "en_US.ISO8859-1") {
        if(has_std_locale("English_United States.1252")) {
            if(real_name) 
                *real_name = "English_United States.1252";
            return utf8 ? name : "en_US.windows-1252";
        }
        return "";
    }
    else if(name=="he_IL.UTF-8" || name == "he_IL.ISO8859-8")  {
        if(has_std_locale("Hebrew_Israel.1255")) {
            if(real_name) 
                *real_name = "Hebrew_Israel.1255";
            return utf8 ? name : "he_IL.windows-1255";
            return name;
        }
    }
    else if(name=="ru_RU.UTF-8")  {
        if(has_std_locale("Russian_Russia.1251")) {
            if(real_name) 
                *real_name = "Russian_Russia.1251";
            return name;
        }
    }
    else if(name == "tr_TR.UTF-8") {
        if(has_std_locale("Turkish_Turkey.1254")) {
            if(real_name) 
                *real_name = "Turkish_Turkey.1254";
            return name;
        }
    }
    if(name == "ja_JP.SJIS") {
        if(has_std_locale("Japanese_Japan.932")) {
            if(real_name) 
                *real_name = "Japanese_Japan.932";
            return name;
        }
        return "";
    }
    #endif
    return "";
}